

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
               (bit_array *x,default_cost_type<long_double> *c,int variables,int value_if_0)

{
  bool bVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int index;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  longdouble lVar2;
  undefined4 local_24;
  int i;
  int value_if_0_local;
  int variables_local;
  default_cost_type<long_double> *c_local;
  bit_array *x_local;
  
  index = variables;
  for (local_24 = 0; local_24 != variables; local_24 = local_24 + 1) {
    default_cost_type<long_double>::operator[]
              ((longdouble *)c,(default_cost_type<long_double> *)(ulong)local_24,index);
    lVar2 = in_ST7;
    bVar1 = init_x<baryonyx::itm::maximize_tag,long_double>(in_ST0,value_if_0);
    if (bVar1) {
      bit_array_impl::set(&x->super_bit_array_impl,local_24);
      index = extraout_EDX;
    }
    else {
      bit_array_impl::unset(&x->super_bit_array_impl,local_24);
      index = extraout_EDX_00;
    }
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = in_ST7;
    in_ST7 = lVar2;
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}